

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O2

void av1_encode_tile(AV1_COMP *cpi,ThreadData_conflict *td,int tile_row,int tile_col)

{
  uint8_t uVar1;
  byte bVar2;
  SequenceHeader *pSVar3;
  ENTROPY_CONTEXT *pEVar4;
  MB_RD_RECORD *pMVar5;
  int iVar6;
  size_t __n;
  long lVar7;
  ulong uVar8;
  TileDataEnc *tile_data;
  int iVar9;
  
  tile_data = cpi->tile_data + ((cpi->common).tiles.cols * tile_row + tile_col);
  if ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0) {
    av1_inter_mode_data_init(tile_data);
  }
  iVar9 = (tile_data->tile_info).mi_col_start;
  pSVar3 = (cpi->common).seq_params;
  uVar1 = pSVar3->monochrome;
  uVar8 = -1L << ((byte)pSVar3->mib_size_log2 & 0x3f);
  bVar2 = (byte)pSVar3->subsampling_x;
  uVar8 = (long)(int)(~(uint)uVar8 + ((tile_data->tile_info).mi_col_end - iVar9)) & uVar8;
  iVar6 = iVar9 >> (bVar2 & 0x1f);
  memset((cpi->common).above_contexts.entropy[0][tile_row] + iVar9,0,uVar8);
  if (uVar1 == '\0') {
    pEVar4 = (cpi->common).above_contexts.entropy[1][tile_row];
    if ((pEVar4 == (ENTROPY_CONTEXT *)0x0) ||
       ((cpi->common).above_contexts.entropy[2][tile_row] == (ENTROPY_CONTEXT *)0x0)) {
      aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_CORRUPT_FRAME,"Invalid value of planes"
                        );
    }
    else {
      __n = (size_t)((int)uVar8 >> (bVar2 & 0x1f));
      memset(pEVar4 + iVar6,0,__n);
      memset((cpi->common).above_contexts.entropy[2][tile_row] + iVar6,0,__n);
    }
  }
  memset((cpi->common).above_contexts.partition[tile_row] + iVar9,0,uVar8);
  memset((cpi->common).above_contexts.txfm[tile_row] + iVar9,0x40,uVar8);
  uVar1 = ((cpi->common).seq_params)->monochrome;
  for (lVar7 = 0; (ulong)(uVar1 == '\0') * 2 + 1 != lVar7; lVar7 = lVar7 + 1) {
    (td->mb).e_mbd.above_entropy_context[lVar7] =
         (cpi->common).above_contexts.entropy[lVar7][tile_row];
  }
  (td->mb).e_mbd.above_partition_context = (cpi->common).above_contexts.partition[tile_row];
  (td->mb).e_mbd.above_txfm_context = (cpi->common).above_contexts.txfm[tile_row];
  if ((cpi->oxcf).intra_mode_cfg.enable_cfl_intra == true) {
    cfl_init(&(td->mb).e_mbd.cfl,(cpi->common).seq_params);
  }
  pMVar5 = (td->mb).txfm_search_info.mb_rd_record;
  if (pMVar5 != (MB_RD_RECORD *)0x0) {
    av1_crc32c_calculator_init(&pMVar5->crc_calculator);
  }
  for (iVar9 = (tile_data->tile_info).mi_row_start; iVar9 < (tile_data->tile_info).mi_row_end;
      iVar9 = iVar9 + ((cpi->common).seq_params)->mib_size) {
    av1_encode_sb_row(cpi,td,tile_row,tile_col,iVar9);
  }
  tile_data->abs_sum_level = td->abs_sum_level;
  return;
}

Assistant:

void av1_encode_tile(AV1_COMP *cpi, ThreadData *td, int tile_row,
                     int tile_col) {
  AV1_COMMON *const cm = &cpi->common;
  TileDataEnc *const this_tile =
      &cpi->tile_data[tile_row * cm->tiles.cols + tile_col];
  const TileInfo *const tile_info = &this_tile->tile_info;

  if (!cpi->sf.rt_sf.use_nonrd_pick_mode) av1_inter_mode_data_init(this_tile);

  av1_zero_above_context(cm, &td->mb.e_mbd, tile_info->mi_col_start,
                         tile_info->mi_col_end, tile_row);
  av1_init_above_context(&cm->above_contexts, av1_num_planes(cm), tile_row,
                         &td->mb.e_mbd);

#if !CONFIG_REALTIME_ONLY
  if (cpi->oxcf.intra_mode_cfg.enable_cfl_intra)
    cfl_init(&td->mb.e_mbd.cfl, cm->seq_params);
#endif

  if (td->mb.txfm_search_info.mb_rd_record != NULL) {
    av1_crc32c_calculator_init(
        &td->mb.txfm_search_info.mb_rd_record->crc_calculator);
  }

  for (int mi_row = tile_info->mi_row_start; mi_row < tile_info->mi_row_end;
       mi_row += cm->seq_params->mib_size) {
    av1_encode_sb_row(cpi, td, tile_row, tile_col, mi_row);
  }
  this_tile->abs_sum_level = td->abs_sum_level;
}